

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  char *pcVar16;
  ulong uVar17;
  ulong unaff_R13;
  char *__s;
  char local_3b [7];
  int iStack_34;
  char format [7];
  
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x47e,"empty buffer");
  }
  iStack_34 = 5;
  if (-1 < precision) {
    iStack_34 = precision + -1;
  }
  bVar14 = specs._4_1_;
  if (1 < bVar14) {
    iStack_34 = precision;
  }
  local_3b[0] = '%';
  if (bVar14 == 3 && (specs._4_4_ >> 0x14 & 1) != 0) {
    pbVar8 = (byte *)(local_3b + 2);
    local_3b[1] = 0x23;
  }
  else {
    pbVar8 = (byte *)(local_3b + 1);
  }
  if (-1 < iStack_34) {
    pbVar8[0] = 0x2e;
    pbVar8[1] = 0x2a;
    pbVar8 = pbVar8 + 2;
  }
  if (bVar14 == 3) {
    bVar11 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar11 = (bVar14 == 2) + 0x65;
  }
  *pbVar8 = bVar11;
  pbVar8[1] = 0;
  sVar3 = buf->size_;
  do {
    __s = buf->ptr_ + sVar3;
    uVar12 = buf->capacity_ - sVar3;
    if (iStack_34 < 0) {
      uVar7 = snprintf(__s,uVar12,local_3b,value);
    }
    else {
      uVar7 = snprintf(__s,uVar12,local_3b,value);
    }
    uVar17 = (ulong)uVar7;
    if ((int)uVar7 < 0) {
      bVar5 = true;
      if (buf->capacity_ != 0xffffffffffffffff) {
        (**buf->_vptr_buffer)(buf,buf->capacity_ + 1);
      }
    }
    else if (uVar17 < uVar12) {
      if (bVar14 == 2) {
        if (iStack_34 != 0) {
          unaff_R13 = 1;
          do {
            lVar6 = unaff_R13 + (uVar17 - 2);
            unaff_R13 = unaff_R13 - 1;
          } while ((byte)(__s[lVar6] - 0x30U) < 10);
          if (0 < (int)unaff_R13) {
LAB_00232b5a:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                        ,0x13c,"negative value");
          }
          memmove(__s + unaff_R13 + uVar17 + -1,__s + unaff_R13 + uVar17,
                  (ulong)(-(int)unaff_R13 & 0x7fffffff));
          uVar12 = (ulong)(uVar7 - 1);
          if (buf->capacity_ < uVar12) {
            (**buf->_vptr_buffer)(buf,uVar12);
          }
          if (buf->capacity_ < uVar12) {
            uVar12 = buf->capacity_;
          }
          buf->size_ = uVar12;
          goto LAB_00232b1c;
        }
      }
      else {
        if (bVar14 != 3) {
          uVar9 = 1;
          uVar12 = uVar17 - 2;
          lVar6 = 1;
          pcVar1 = __s;
          do {
            pcVar16 = pcVar1;
            lVar10 = lVar6;
            uVar13 = uVar12;
            uVar9 = uVar9 + 1;
            uVar12 = uVar13 - 1;
            lVar6 = lVar10 + -1;
            pcVar1 = pcVar16 + -1;
          } while (pcVar16[uVar17 - 1] != 'e');
          cVar2 = pcVar16[uVar17];
          if ((cVar2 != '+') && (cVar2 != '-')) {
            __assert_fail("sign == \'+\' || sign == \'-\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                          ,0x4cc,
                          "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                         );
          }
          iVar15 = 0;
          do {
            if (9 < (byte)(__s[lVar10 + uVar17] - 0x30U)) {
              __assert_fail("is_digit(*p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                            ,0x4d0,
                            "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                           );
            }
            iVar15 = (uint)(byte)__s[lVar10 + uVar17] + iVar15 * 10 + -0x30;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0);
          iVar4 = -iVar15;
          if (cVar2 != '-') {
            iVar4 = iVar15;
          }
          uVar12 = 0;
          if (uVar17 != uVar9) {
            do {
              pcVar1 = __s + uVar13;
              uVar13 = uVar13 - 1;
            } while (*pcVar1 == '0');
            if ((int)(uint)uVar13 < 0) goto LAB_00232b5a;
            memmove(__s + 1,__s + 2,(ulong)((uint)uVar13 & 0x7fffffff));
            uVar12 = uVar13 & 0xffffffff;
          }
          uVar17 = uVar12 + sVar3 + 1;
          if (buf->capacity_ < uVar17) {
            (**buf->_vptr_buffer)(buf,uVar17);
          }
          if (buf->capacity_ < uVar17) {
            uVar17 = buf->capacity_;
          }
          buf->size_ = uVar17;
          unaff_R13 = (ulong)(uint)(iVar4 - (int)uVar12);
LAB_00232b1c:
          bVar5 = false;
          goto LAB_00232b1e;
        }
        uVar17 = uVar17 + sVar3;
      }
      if (buf->capacity_ < uVar17) {
        (**buf->_vptr_buffer)(buf,uVar17);
      }
      if (buf->capacity_ < uVar17) {
        uVar17 = buf->capacity_;
      }
      buf->size_ = uVar17;
      bVar5 = false;
      unaff_R13 = 0;
    }
    else {
      uVar17 = uVar17 + sVar3 + 1;
      bVar5 = true;
      if (buf->capacity_ < uVar17) {
        (**buf->_vptr_buffer)(buf,uVar17);
      }
    }
LAB_00232b1e:
    if (!bVar5) {
      return (int)unaff_R13;
    }
  } while( true );
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}